

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QSize __thiscall QWidget::sizeIncrement(QWidget *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QSize *in_stack_ffffffffffffffd0;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36a3a5);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a3b8);
  if (bVar2) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a3cc);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x36a3d8);
    if (bVar2) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a3ec);
      std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x36a3f8);
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a411);
      std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x36a41d);
      QSize::QSize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      goto LAB_0036a442;
    }
  }
  QSize::QSize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
LAB_0036a442:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QWidget::sizeIncrement() const
{
    Q_D(const QWidget);
    return (d->extra && d->extra->topextra)
        ? QSize(d->extra->topextra->incw, d->extra->topextra->inch)
        : QSize(0, 0);
}